

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SplitterBehavior
               (ImGuiID id,ImRect *bb,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 col_00;
  ImGuiMouseCursor cursor_type;
  ImGuiCol local_a8;
  float local_a4;
  ImU32 col;
  float local_94;
  ImVec2 IStack_90;
  float mouse_delta;
  ImVec2 local_88;
  ImVec2 mouse_delta_2d;
  ImRect bb_render;
  undefined1 local_68 [8];
  ImRect bb_interact;
  bool held;
  bool hovered;
  bool item_add;
  ImGuiItemFlags item_flags_backup;
  ImGuiWindow *window;
  ImGuiContext *g;
  float hover_extend_local;
  float min_size2_local;
  float min_size1_local;
  float *size2_local;
  float *size1_local;
  ImGuiAxis axis_local;
  ImRect *bb_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  bb_interact.Max.y = (float)(pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = (pIVar1->DC).ItemFlags | 0x18;
  bb_interact.Max.x._3_1_ = ItemAdd(bb,id,(ImRect *)0x0);
  (pIVar1->DC).ItemFlags = (ImGuiItemFlags)bb_interact.Max.y;
  if ((bool)bb_interact.Max.x._3_1_) {
    local_68 = *(undefined1 (*) [8])&bb->Min;
    bb_interact.Min = bb->Max;
    if (axis == ImGuiAxis_Y) {
      ImVec2::ImVec2(&bb_render.Max,0.0,hover_extend);
    }
    else {
      ImVec2::ImVec2(&bb_render.Max,hover_extend,0.0);
    }
    ImRect::Expand((ImRect *)local_68,&bb_render.Max);
    ButtonBehavior((ImRect *)local_68,id,(bool *)((long)&bb_interact.Max.x + 2),
                   (bool *)((long)&bb_interact.Max.x + 1),0x60);
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if (((bb_interact.Max.x._1_1_ & 1) != 0) ||
       ((pIVar2->HoveredId == id && (pIVar2->HoveredIdPreviousFrame == id)))) {
      cursor_type = 4;
      if (axis == ImGuiAxis_Y) {
        cursor_type = 3;
      }
      SetMouseCursor(cursor_type);
    }
    mouse_delta_2d = bb->Min;
    bb_render.Min = bb->Max;
    if ((bb_interact.Max.x._1_1_ & 1) != 0) {
      IStack_90 = ::operator-(&(pIVar2->IO).MousePos,&pIVar2->ActiveIdClickOffset);
      local_88 = ::operator-(&stack0xffffffffffffff70,(ImVec2 *)local_68);
      if (axis == ImGuiAxis_Y) {
        local_a4 = local_88.y;
      }
      else {
        local_a4 = local_88.x;
      }
      local_94 = local_a4;
      if (local_a4 < min_size1 - *size1) {
        local_94 = min_size1 - *size1;
      }
      if (*size2 - min_size2 < local_94) {
        local_94 = *size2 - min_size2;
      }
      *size1 = local_94 + *size1;
      *size2 = *size2 - local_94;
      if (axis == ImGuiAxis_X) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,local_94,0.0);
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,0.0,local_94);
      }
      ImRect::Translate((ImRect *)&mouse_delta_2d,(ImVec2 *)&stack0xffffffffffffff64);
    }
    if ((bb_interact.Max.x._1_1_ & 1) == 0) {
      local_a8 = 0x1b;
      if ((bb_interact.Max.x._2_1_ & 1) != 0) {
        local_a8 = 0x1c;
      }
    }
    else {
      local_a8 = 0x1d;
    }
    col_00 = GetColorU32(local_a8,1.0);
    ImDrawList::AddRectFilled
              (pIVar1->DrawList,&mouse_delta_2d,&bb_render.Min,col_00,(pIVar2->Style).FrameRounding,
               0xf);
    bb_local._7_1_ = (bool)(bb_interact.Max.x._1_1_ & 1);
  }
  else {
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::SplitterBehavior(ImGuiID id, const ImRect& bb, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        if (mouse_delta < min_size1 - *size1)
            mouse_delta = min_size1 - *size1;
        if (mouse_delta > *size2 - min_size2)
            mouse_delta = *size2 - min_size2;

        // Apply resize
        *size1 += mouse_delta;
        *size2 -= mouse_delta;
        bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}